

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.cpp
# Opt level: O3

void __thiscall CGL::Application::scroll_event(Application *this,float offset_x,float offset_y)

{
  float fVar1;
  double dVar2;
  undefined1 auVar3 [16];
  
  auVar3 = vsubpd_avx(*(undefined1 (*) [16])&this->field_0xf0,
                      *(undefined1 (*) [16])&this->field_0x110);
  dVar2 = *(double *)&this->field_0x100 - *(double *)&this->field_0x120;
  auVar3 = vdppd_avx(auVar3,auVar3,0x31);
  dVar2 = dVar2 * dVar2 + auVar3._0_8_;
  if (dVar2 < 0.0) {
    dVar2 = sqrt(dVar2);
  }
  else {
    auVar3._8_8_ = 0;
    auVar3._0_8_ = dVar2;
    auVar3 = vsqrtsd_avx(auVar3,auVar3);
    dVar2 = auVar3._0_8_;
  }
  fVar1 = (float)(this->canonical_view_distance / (double)(float)dVar2);
  (this->hoverStyle).strokeWidth = fVar1 + fVar1;
  (this->selectStyle).strokeWidth = fVar1 + fVar1;
  (this->hoverStyle).vertexRadius = fVar1 * 8.0;
  (this->selectStyle).vertexRadius = fVar1 * 8.0;
  if ((this->mode & ~VISUALIZE_MODE) == EDIT_MODE) {
    CGL::Camera::move_forward((double)-offset_y * this->scroll_rate);
    return;
  }
  return;
}

Assistant:

void Application::scroll_event(float offset_x, float offset_y) {

  update_style();

  switch(mode) {
    case EDIT_MODE:
    case VISUALIZE_MODE:
      camera.move_forward(-offset_y * scroll_rate);
      break;
    case RENDER_MODE:
      break;
  }
}